

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O0

class_<kratos::FSM,_std::shared_ptr<kratos::FSM>_> * __thiscall
pybind11::class_<kratos::FSM,std::shared_ptr<kratos::FSM>>::
def<std::shared_ptr<kratos::FSMState>(kratos::FSM::*)(std::__cxx11::string_const&,std::pair<std::__cxx11::string,unsigned_int>const&),pybind11::return_value_policy>
          (class_<kratos::FSM,std::shared_ptr<kratos::FSM>> *this,char *name_,
          offset_in_Var_to_subr *f,return_value_policy *extra)

{
  offset_in_Var_to_subr f_00;
  name *extra_00;
  handle local_78;
  PyObject *local_70;
  handle local_68;
  handle local_60;
  sibling local_58;
  is_method local_50;
  is_method local_48;
  void *local_40;
  offset_in_Var_to_subr local_38;
  cpp_function local_30;
  cpp_function cf;
  return_value_policy *extra_local;
  offset_in_Var_to_subr *f_local;
  char *name__local;
  class_<kratos::FSM,_std::shared_ptr<kratos::FSM>_> *this_local;
  
  local_40 = (void *)*f;
  local_38 = f[1];
  cf.super_function.super_object.super_handle.m_ptr = (function)(function)extra;
  f_00 = _kratos__FSM___pybind11__method_adaptor<kratos::FSM,std::shared_ptr<kratos::FSMState>,kratos::FSM,std::__cxx11::string_const&,std::pair<std::__cxx11::string,unsigned_int>const&>_std__shared_ptr<kratos::FSMState>_kratos__FSM_____std____cxx11__string_const__std__pair<std::__cxx11::string,unsigned_int>const____
                   (local_40,local_38);
  pybind11::name::name((name *)&local_48,name_);
  is_method::is_method(&local_50,(handle *)this);
  local_68.m_ptr = *(PyObject **)this;
  none::none((none *)&local_78);
  local_70 = local_78.m_ptr;
  getattr((pybind11 *)&local_60,local_68,name_,local_78);
  sibling::sibling(&local_58,&local_60);
  cpp_function::
  cpp_function<std::shared_ptr<kratos::FSMState>,kratos::FSM,std::__cxx11::string_const&,std::pair<std::__cxx11::string,unsigned_int>const&,pybind11::name,pybind11::is_method,pybind11::sibling,pybind11::return_value_policy>
            (&local_30,f_00,extra_00,&local_48,(sibling *)&local_50,(return_value_policy *)&local_58
            );
  object::~object((object *)&local_60);
  none::~none((none *)&local_78);
  pybind11::detail::add_class_method((object *)this,name_,&local_30);
  cpp_function::~cpp_function(&local_30);
  return (class_<kratos::FSM,_std::shared_ptr<kratos::FSM>_> *)this;
}

Assistant:

class_ &def(const char *name_, Func&& f, const Extra&... extra) {
        cpp_function cf(method_adaptor<type>(std::forward<Func>(f)), name(name_), is_method(*this),
                        sibling(getattr(*this, name_, none())), extra...);
        add_class_method(*this, name_, cf);
        return *this;
    }